

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

string * nite::strAt(string *__return_storage_ptr__,string *Input,uint x)

{
  ulong uVar1;
  pointer pcVar2;
  undefined8 uVar3;
  ulong uVar4;
  
  uVar4 = (ulong)x;
  uVar1 = Input->_M_string_length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (uVar1 < uVar4) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    pcVar2 = (Input->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + uVar1);
    if (__return_storage_ptr__->_M_string_length <= uVar4) {
      uVar3 = std::__throw_out_of_range_fmt
                        ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar4
                        );
      pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != &__return_storage_ptr__->field_2) {
        operator_delete(pcVar2);
      }
      _Unwind_Resume(uVar3);
    }
    std::__cxx11::string::_M_replace_aux
              ((ulong)__return_storage_ptr__,0,__return_storage_ptr__->_M_string_length,'\x01');
  }
  return __return_storage_ptr__;
}

Assistant:

String nite::strAt(const String &Input, unsigned x){
	if (x>Input.length())
		return "";
	String output = Input;
	output = output.at(x);
	return output;
}